

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O1

void __thiscall LSMTree::reset(LSMTree *this)

{
  MemTable *pMVar1;
  DiskTable *pDVar2;
  
  pMVar1 = this->memory;
  if (pMVar1 != (MemTable *)0x0) {
    (pMVar1->
    super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    )._vptr_Dictionary = (_func_int **)&PTR_size_0010fc90;
    std::__cxx11::
    _List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::_M_clear
              (&(pMVar1->qlist).
                super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
              );
    operator_delete(pMVar1,0x30);
  }
  pDVar2 = this->disk;
  if (pDVar2 != (DiskTable *)0x0) {
    DiskTable::~DiskTable(pDVar2);
    operator_delete(pDVar2,0x58);
  }
  std::filesystem::remove_all(&this->data_home);
  pMVar1 = (MemTable *)operator_new(0x30);
  MemTable::MemTable(pMVar1);
  this->memory = pMVar1;
  pDVar2 = (DiskTable *)operator_new(0x58);
  DiskTable::DiskTable(pDVar2,&this->data_home);
  this->disk = pDVar2;
  return;
}

Assistant:

void LSMTree::reset() {
    delete memory;
    delete disk;
    remove_all(data_home);
    memory = new MemTable{};
    disk = new DiskTable{data_home};
}